

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

bool Diligent::ValidateBufferMode<Diligent::BufferViewVkImpl>
               (PipelineResourceDesc *ResDesc,Uint32 ArrayIndex,BufferViewVkImpl *pBufferView)

{
  undefined8 uVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  int iVar3;
  IBuffer *pIVar4;
  undefined4 extraout_var;
  BufferViewDesc *pBVar5;
  Char *pCVar6;
  bool bVar7;
  char (*in_stack_ffffffffffffff08) [46];
  String local_c0;
  undefined1 local_a0 [8];
  string msg_1;
  String local_70;
  undefined1 local_50 [8];
  string msg;
  BufferDesc *BuffDesc;
  bool BindingOK;
  BufferViewVkImpl *pBufferView_local;
  Uint32 ArrayIndex_local;
  PipelineResourceDesc *ResDesc_local;
  
  BuffDesc._7_1_ = true;
  if (pBufferView != (BufferViewVkImpl *)0x0) {
    pIVar4 = BufferViewBase<Diligent::EngineVkImplTraits>::GetBuffer
                       (&pBufferView->super_BufferViewBase<Diligent::EngineVkImplTraits>);
    iVar3 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    msg.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
    PVar2 = operator&(ResDesc->Flags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
    if (PVar2 == PIPELINE_RESOURCE_FLAG_NONE) {
      if ((*(char *)(msg.field_2._8_8_ + 0x16) != '\x02') &&
         (*(char *)(msg.field_2._8_8_ + 0x16) != '\x03')) {
        pBVar5 = DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                            *)pBufferView);
        uVar1 = msg.field_2._8_8_;
        GetShaderResourcePrintName<Diligent::PipelineResourceDesc>(&local_c0,ResDesc,ArrayIndex);
        FormatString<char[28],char_const*,char[14],char_const*,char[23],std::__cxx11::string,char[46]>
                  ((string *)local_a0,(Diligent *)"Error binding buffer view \'",
                   (char (*) [28])pBVar5,(char **)"\' of buffer \'",(char (*) [14])uVar1,
                   (char **)"\' to shader variable \'",(char (*) [23])&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\': structured or raw buffer view is expected.",in_stack_ffffffffffffff08);
        std::__cxx11::string::~string((string *)&local_c0);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"ValidateBufferMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x1eb);
        std::__cxx11::string::~string((string *)local_a0);
        BuffDesc._7_1_ = false;
      }
    }
    else {
      bVar7 = *(char *)(msg.field_2._8_8_ + 0x16) != '\x01';
      if (bVar7) {
        pBVar5 = DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                            *)pBufferView);
        uVar1 = msg.field_2._8_8_;
        GetShaderResourcePrintName<Diligent::PipelineResourceDesc>(&local_70,ResDesc,ArrayIndex);
        FormatString<char[28],char_const*,char[14],char_const*,char[23],std::__cxx11::string,char[38]>
                  ((string *)local_50,(Diligent *)"Error binding buffer view \'",
                   (char (*) [28])pBVar5,(char **)"\' of buffer \'",(char (*) [14])uVar1,
                   (char **)"\' to shader variable \'",(char (*) [23])&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\': formatted buffer view is expected.",(char (*) [38])in_stack_ffffffffffffff08
                  );
        std::__cxx11::string::~string((string *)&local_70);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"ValidateBufferMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x1e1);
        std::__cxx11::string::~string((string *)local_50);
      }
      BuffDesc._7_1_ = !bVar7;
    }
  }
  return BuffDesc._7_1_;
}

Assistant:

bool ValidateBufferMode(const PipelineResourceDesc& ResDesc,
                        Uint32                      ArrayIndex,
                        const BufferViewImplType*   pBufferView)
{
    bool BindingOK = true;
    if (pBufferView != nullptr)
    {
        const BufferDesc& BuffDesc = pBufferView->GetBuffer()->GetDesc();
        if (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER)
        {
            if (BuffDesc.Mode != BUFFER_MODE_FORMATTED)
            {
                RESOURCE_VALIDATION_FAILURE("Error binding buffer view '", pBufferView->GetDesc().Name, "' of buffer '", BuffDesc.Name, "' to shader variable '",
                                            GetShaderResourcePrintName(ResDesc, ArrayIndex), "': formatted buffer view is expected.");

                BindingOK = false;
            }
        }
        else
        {
            if (BuffDesc.Mode != BUFFER_MODE_STRUCTURED && BuffDesc.Mode != BUFFER_MODE_RAW)
            {
                RESOURCE_VALIDATION_FAILURE("Error binding buffer view '", pBufferView->GetDesc().Name, "' of buffer '", BuffDesc.Name, "' to shader variable '",
                                            GetShaderResourcePrintName(ResDesc, ArrayIndex), "': structured or raw buffer view is expected.");

                BindingOK = false;
            }
        }
    }

    return BindingOK;
}